

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  iterator I;
  void *pvVar1;
  size_t sVar2;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this_local;
  
  I = (iterator)
      (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  pvVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->Slabs);
  DeallocateSlabs(this,I,(iterator)((long)pvVar1 + sVar2 * 8));
  DeallocateCustomSizedSlabs(this);
  SmallVector<std::pair<void_*,_unsigned_long>,_0U>::~SmallVector(&this->CustomSizedSlabs);
  SmallVector<void_*,_4U>::~SmallVector(&this->Slabs);
  return;
}

Assistant:

~BumpPtrAllocatorImpl() {
    DeallocateSlabs(Slabs.begin(), Slabs.end());
    DeallocateCustomSizedSlabs();
  }